

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonTests.cc
# Opt level: O2

void avro::json::testObject2(void)

{
  undefined **ppuVar1;
  Object *this;
  const_iterator cVar2;
  Array *pAVar3;
  String *pSVar4;
  Entity *pEVar5;
  string *psVar6;
  shared_count *psVar7;
  unit_test_log_t *puVar8;
  _Base_ptr this_00;
  char *local_2d0;
  char *local_2c8;
  undefined1 local_2c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  assertion_result local_2a0;
  undefined **local_288;
  Entity n;
  long *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  const_string local_240;
  const_string local_230;
  char *local_220;
  char *local_218;
  const_string local_210;
  const_string local_200;
  const_string local_1f0;
  const_string local_1e0;
  char *local_1d0;
  char *local_1c8;
  const_string local_1c0;
  const_string local_1b0;
  char *local_1a0;
  char *local_198;
  const_string local_190;
  const_string local_180;
  char *local_170;
  char *local_168;
  const_string local_160;
  const_string local_150;
  const_string local_140;
  const_string local_130;
  const_string local_120;
  const_string local_110;
  const_string local_100;
  char *local_f0;
  char *local_e8;
  const_string local_e0;
  const_string local_d0;
  const_string local_c0;
  const_string local_b0;
  const_string local_a0;
  char *local_90;
  char *local_88;
  const_string local_80;
  const_string local_70;
  char *local_60;
  char *local_58;
  const_string local_50;
  const_string local_40;
  
  pEVar5 = &n;
  avro::json::loadEntity((char *)pEVar5);
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pEVar5,&local_40,0x9e,&local_50);
  local_2c0[8] = false;
  local_2c0._0_8_ = &PTR__lazy_ostream_001d6a20;
  local_2b0._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_2b0._8_8_ = (long)"\t" + 1;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_58 = "";
  local_2a0._0_4_ = _n;
  local_2d0._0_4_ = 6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,avro::json::EntityType,avro::json::EntityType>
            (local_2c0,&local_60,0x9e,1,2,&local_2a0,"n.type()",&local_2d0,"etObject");
  pEVar5 = &n;
  this = Entity::objectValue_abi_cxx11_(pEVar5);
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_70.m_end = "";
  local_80.m_begin = "";
  local_80.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pEVar5,&local_70,0xa0,&local_80);
  local_2c0[8] = false;
  local_2c0._0_8_ = &PTR__lazy_ostream_001d6a20;
  local_2b0._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_2b0._8_8_ = (long)"\t" + 1;
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_88 = "";
  local_2a0._0_8_ = *(undefined8 *)(this + 0x28);
  local_2d0 = (char *)CONCAT44(local_2d0._4_4_,2);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (local_2c0,&local_90,0xa0,1,2,&local_2a0,"m.size()",&local_2d0,"2");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2c0,"k1",(allocator<char> *)&local_2a0);
  local_288 = &PTR__lazy_ostream_001d6a20;
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                  *)this,(key_type *)local_2c0);
  psVar6 = (string *)local_2c0;
  std::__cxx11::string::~string(psVar6);
  local_a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_a0.m_end = "";
  local_b0.m_begin = "";
  local_b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar6,&local_a0,0xa3,&local_b0);
  local_2a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(cVar2._M_node != (_Base_ptr)(this + 8));
  local_2a0.m_message.px = (element_type *)0x0;
  local_2a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2d0 = "it != m.end()";
  local_2c8 = "";
  local_2c0[8] = false;
  local_2c0._0_8_ = &PTR__lazy_ostream_001d60a0;
  local_2b0._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_2b0._8_8_ = &local_2d0;
  local_c0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_c0.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_2a0,(lazy_ostream *)local_2c0,&local_c0,0xa3,CHECK,CHECK_PRED,0);
  psVar7 = &local_2a0.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar7);
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_d0.m_end = "";
  local_e0.m_begin = "";
  local_e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar7,&local_d0,0xa4,&local_e0);
  puVar8 = (unit_test_log_t *)local_2c0;
  local_2c0[8] = false;
  local_2c0._0_8_ = local_288;
  local_2b0._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_2b0._8_8_ = (long)"\t" + 1;
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_e8 = "";
  local_2a0._0_4_ = cVar2._M_node[2]._M_color;
  local_2d0 = (char *)CONCAT44(local_2d0._4_4_,2);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,avro::json::EntityType,avro::json::EntityType>
            (puVar8,&local_f0,0xa4,1,2,&local_2a0,"it->second.type()",&local_2d0,"etLong");
  local_100.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_100.m_end = "";
  local_110.m_begin = "";
  local_110.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar8,&local_100,0xa5,&local_110);
  local_2c0[8] = false;
  local_2c0._0_8_ = local_288;
  local_2b0._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_2b0._8_8_ = (long)"\t" + 1;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_248 = "";
  local_2a0._0_8_ = Entity::longValue((Entity *)(*(long *)(this + 0x18) + 0x40));
  local_2d0 = (char *)0x64;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
            (local_2c0,&local_250,0xa5,1,2,&local_2a0,"m.begin()->second.longValue()",&local_2d0,
             "100ll");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2c0,"k2",(allocator<char> *)&local_2a0);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                  *)this,(key_type *)local_2c0);
  psVar6 = (string *)local_2c0;
  std::__cxx11::string::~string(psVar6);
  local_120.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_120.m_end = "";
  local_130.m_begin = "";
  local_130.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar6,&local_120,0xa8,&local_130);
  local_2a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(cVar2._M_node != (_Base_ptr)(this + 8));
  local_2a0.m_message.px = (element_type *)0x0;
  local_2a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2d0 = "it != m.end()";
  local_2c8 = "";
  local_2c0[8] = false;
  local_2c0._0_8_ = &PTR__lazy_ostream_001d60a0;
  local_2b0._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_2b0._8_8_ = &local_2d0;
  local_140.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_140.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_2a0,(lazy_ostream *)local_2c0,&local_140,0xa8,CHECK,CHECK_PRED,0);
  psVar7 = &local_2a0.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar7);
  local_150.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_150.m_end = "";
  local_160.m_begin = "";
  local_160.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar7,&local_150,0xa9,&local_160);
  ppuVar1 = local_288;
  local_2c0[8] = false;
  local_2c0._0_8_ = local_288;
  local_2b0._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_2b0._8_8_ = (long)"\t" + 1;
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_168 = "";
  local_2a0._0_4_ = cVar2._M_node[2]._M_color;
  local_2d0._0_4_ = 5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,avro::json::EntityType,avro::json::EntityType>
            (local_2c0,&local_170,0xa9,1,2,&local_2a0,"it->second.type()",&local_2d0,"etArray");
  this_00 = cVar2._M_node + 2;
  pAVar3 = Entity::arrayValue((Entity *)this_00);
  local_180.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_180.m_end = "";
  local_190.m_begin = "";
  local_190.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_180,0xab,&local_190);
  puVar8 = (unit_test_log_t *)local_2c0;
  local_2c0[8] = false;
  local_2c0._0_8_ = ppuVar1;
  local_2b0._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_2b0._8_8_ = (long)"\t" + 1;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_198 = "";
  local_2a0._0_8_ = *(long *)(pAVar3 + 8) - *(long *)pAVar3 >> 4;
  local_2d0._0_4_ = 2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (puVar8,&local_1a0,0xab,1,2,&local_2a0,"a.size()",&local_2d0,"2");
  local_1b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_1b0.m_end = "";
  local_1c0.m_begin = "";
  local_1c0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar8,&local_1b0,0xac,&local_1c0);
  puVar8 = (unit_test_log_t *)local_2c0;
  local_2c0[8] = false;
  local_2c0._0_8_ = ppuVar1;
  local_2b0._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_2b0._8_8_ = (long)"\t" + 1;
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_1c8 = "";
  local_2a0._0_4_ = **(undefined4 **)pAVar3;
  local_2d0 = (char *)CONCAT44(local_2d0._4_4_,2);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,avro::json::EntityType,avro::json::EntityType>
            (puVar8,&local_1d0,0xac,1,2,&local_2a0,"a[0].type()",&local_2d0,"etLong");
  local_1e0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_1e0.m_end = "";
  local_1f0.m_begin = "";
  local_1f0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar8,&local_1e0,0xad,&local_1f0);
  local_2c0[8] = false;
  local_2c0._0_8_ = ppuVar1;
  local_2b0._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_2b0._8_8_ = (long)"\t" + 1;
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_258 = "";
  local_2a0._0_8_ = Entity::longValue(*(Entity **)pAVar3);
  local_2d0 = (char *)0x190;
  puVar8 = (unit_test_log_t *)local_2c0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
            (puVar8,&local_260,0xad,1,2,&local_2a0,"a[0].longValue()",&local_2d0,"400ll");
  local_200.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_200.m_end = "";
  local_210.m_begin = "";
  local_210.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar8,&local_200,0xae,&local_210);
  puVar8 = (unit_test_log_t *)local_2c0;
  local_2c0[8] = false;
  local_2c0._0_8_ = ppuVar1;
  local_2b0._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_2b0._8_8_ = (long)"\t" + 1;
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_218 = "";
  local_2a0._0_4_ = *(undefined4 *)(*(long *)pAVar3 + 0x10);
  local_2d0 = (char *)CONCAT44(local_2d0._4_4_,4);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,avro::json::EntityType,avro::json::EntityType>
            (puVar8,&local_220,0xae,1,2,&local_2a0,"a[1].type()",&local_2d0,"etString");
  local_230.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_230.m_end = "";
  local_240.m_begin = "";
  local_240.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar8,&local_230,0xaf,&local_240);
  local_2c0[8] = false;
  local_2c0._0_8_ = ppuVar1;
  local_2b0._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_2b0._8_8_ = (long)"\t" + 1;
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_268 = "";
  pSVar4 = Entity::stringValue_abi_cxx11_((Entity *)(*(long *)pAVar3 + 0x10));
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
            (local_2c0,&local_270,0xaf,1,2,pSVar4,"a[1].stringValue()","v0","\"v0\"");
  if (local_278 != (long *)0x0) {
    (**(code **)(*local_278 + 8))();
  }
  return;
}

Assistant:

static void testObject2()
{
    Entity n = loadEntity("{\"k1\": 100, \"k2\": [400, \"v0\"]}");
    BOOST_CHECK_EQUAL(n.type(), etObject);
    const Object& m = n.objectValue();
    BOOST_CHECK_EQUAL(m.size(), 2);

    Object::const_iterator it = m.find("k1");
    BOOST_CHECK(it != m.end());
    BOOST_CHECK_EQUAL(it->second.type(), etLong);
    BOOST_CHECK_EQUAL(m.begin()->second.longValue(), 100ll);

    it = m.find("k2");
    BOOST_CHECK(it != m.end());
    BOOST_CHECK_EQUAL(it->second.type(), etArray);
    const Array& a = it->second.arrayValue();
    BOOST_CHECK_EQUAL(a.size(), 2);
    BOOST_CHECK_EQUAL(a[0].type(), etLong);
    BOOST_CHECK_EQUAL(a[0].longValue(), 400ll);
    BOOST_CHECK_EQUAL(a[1].type(), etString);
    BOOST_CHECK_EQUAL(a[1].stringValue(), "v0");
}